

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_popup_set_scroll(nk_context *ctx,nk_uint offset_x,nk_uint offset_y)

{
  nk_window *pnVar1;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4296,"void nk_popup_set_scroll(struct nk_context *, nk_uint, nk_uint)");
  }
  pnVar1 = ctx->current;
  if (pnVar1 != (nk_window *)0x0) {
    if (pnVar1->layout != (nk_panel *)0x0) {
      (pnVar1->scrollbar).x = offset_x;
      (pnVar1->scrollbar).y = offset_y;
      return;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4298,"void nk_popup_set_scroll(struct nk_context *, nk_uint, nk_uint)");
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x4297,"void nk_popup_set_scroll(struct nk_context *, nk_uint, nk_uint)");
}

Assistant:

NK_API void
nk_popup_set_scroll(struct nk_context *ctx, nk_uint offset_x, nk_uint offset_y)
{
    struct nk_window *popup;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    popup = ctx->current;
    popup->scrollbar.x = offset_x;
    popup->scrollbar.y = offset_y;
}